

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

void __thiscall zmq::epoll_t::loop(epoll_t *this)

{
  pointer pppVar1;
  int iVar2;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  int *piVar6;
  char *errmsg_;
  long lVar7;
  pointer pppVar8;
  epoll_event ev_buf [256];
  
  do {
    while( true ) {
      while( true ) {
        uVar4 = poller_base_t::execute_timers((poller_base_t *)this);
        iVar2 = poller_base_t::get_load((poller_base_t *)this);
        uVar3 = (uint)uVar4;
        if (iVar2 != 0) break;
        if (uVar3 == 0) {
          return;
        }
      }
      uVar3 = epoll_wait(this->_epoll_fd,(epoll_event *)ev_buf,0x100,-(uint)(uVar3 == 0) | uVar3);
      if (uVar3 != 0xffffffff) break;
      piVar6 = __errno_location();
      if (*piVar6 != 4) {
        errmsg_ = strerror(*piVar6);
        fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/epoll.cpp"
                ,0xbb);
        fflush(_stderr);
        zmq_abort(errmsg_);
      }
    }
    uVar5 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar5 = 0;
    }
    for (lVar7 = 0; uVar5 * 0xc - lVar7 != 0; lVar7 = lVar7 + 0xc) {
      piVar6 = *(int **)((long)&ev_buf[0].data + lVar7);
      if (*piVar6 != -1) {
        if ((*(byte *)((long)&ev_buf[0].events + lVar7) & 0x18) != 0) {
          (**(code **)(**(long **)(piVar6 + 4) + 0x10))();
          if (*piVar6 == -1) goto LAB_001a5152;
        }
        if ((*(byte *)((long)&ev_buf[0].events + lVar7) & 4) != 0) {
          (**(code **)(**(long **)(piVar6 + 4) + 0x18))();
          if (*piVar6 == -1) goto LAB_001a5152;
        }
        if ((*(byte *)((long)&ev_buf[0].events + lVar7) & 1) != 0) {
          (**(code **)(**(long **)(piVar6 + 4) + 0x10))();
        }
      }
LAB_001a5152:
    }
    pppVar1 = (this->_retired).
              super__Vector_base<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pppVar8 = (this->_retired).
                   super__Vector_base<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; pppVar8 != pppVar1;
        pppVar8 = pppVar8 + 1) {
      operator_delete(*pppVar8,0x18);
      *pppVar8 = (poll_entry_t *)0x0;
    }
    pppVar8 = (this->_retired).
              super__Vector_base<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->_retired).
        super__Vector_base<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != pppVar8) {
      (this->_retired).
      super__Vector_base<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = pppVar8;
    }
  } while( true );
}

Assistant:

void zmq::epoll_t::loop ()
{
    epoll_event ev_buf[max_io_events];

    while (true) {
        //  Execute any due timers.
        const int timeout = static_cast<int> (execute_timers ());

        if (get_load () == 0) {
            if (timeout == 0)
                break;

            // TODO sleep for timeout
            continue;
        }

        //  Wait for events.
        const int n = epoll_wait (_epoll_fd, &ev_buf[0], max_io_events,
                                  timeout ? timeout : -1);
        if (n == -1) {
            errno_assert (errno == EINTR);
            continue;
        }

        for (int i = 0; i < n; i++) {
            const poll_entry_t *const pe =
              static_cast<const poll_entry_t *> (ev_buf[i].data.ptr);

            if (pe->fd == retired_fd)
                continue;
            if (ev_buf[i].events & (EPOLLERR | EPOLLHUP))
                pe->events->in_event ();
            if (pe->fd == retired_fd)
                continue;
            if (ev_buf[i].events & EPOLLOUT)
                pe->events->out_event ();
            if (pe->fd == retired_fd)
                continue;
            if (ev_buf[i].events & EPOLLIN)
                pe->events->in_event ();
        }

        //  Destroy retired event sources.
        for (retired_t::iterator it = _retired.begin (), end = _retired.end ();
             it != end; ++it) {
            LIBZMQ_DELETE (*it);
        }
        _retired.clear ();
    }
}